

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall kj::Promise<kj::OwnFd>::Promise(Promise<kj::OwnFd> *this,Exception *exception)

{
  PromiseBase PVar1;
  PromiseBase local_20;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_18;
  
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_20,exception);
  PVar1.node.ptr = local_20.node.ptr;
  local_20.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)PVar1.node.ptr;
  local_18.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_18);
  Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::ImmediateBrokenPromiseNode,_kj::_::PromiseDisposer> *)&local_20);
  return;
}

Assistant:

Promise<T>::Promise(kj::Exception&& exception)
    : PromiseBase(_::allocPromise<_::ImmediateBrokenPromiseNode>(kj::mv(exception))) {}